

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

Opnd * __thiscall
BackwardPass::
FindNoImplicitCallUse<BackwardPass::ProcessArrayRegOpndUse(IR::Instr*,IR::ArrayRegOpnd*)::__2>
          (BackwardPass *this,Instr *instr,Opnd *opnd,anon_class_8_1_0cadc770 IsCheckedUse,
          Instr **noImplicitCallUsesInstrRef)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  IRKind IVar4;
  bool bVar5;
  undefined4 *puVar6;
  bool local_6a;
  Opnd *checkedSrc;
  Opnd *pOStack_58;
  int i;
  Opnd *checkedSrcs [2];
  Instr *prevInstr;
  Instr **noImplicitCallUsesInstrRef_local;
  Opnd *opnd_local;
  Instr *instr_local;
  BackwardPass *this_local;
  anon_class_8_1_0cadc770 IsCheckedUse_local;
  
  this_local = (BackwardPass *)IsCheckedUse.arrayRegOpnd;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1206,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (instr->m_opcode == NoImplicitCallUses) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                       "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  checkedSrcs[1] = (Opnd *)instr->m_prev;
  do {
    pOVar1 = checkedSrcs[1];
    bVar3 = false;
    if (checkedSrcs[1] != (Opnd *)0x0) {
      IVar4 = IR::Instr::GetKind((Instr *)checkedSrcs[1]);
      local_6a = true;
      if (IVar4 != InstrKindLabel) {
        local_6a = IR::Instr::IsProfiledLabelInstr((Instr *)pOVar1);
      }
      bVar3 = false;
      if (local_6a == false) {
        bVar3 = IR::Instr::IsRealInstr((Instr *)checkedSrcs[1]);
        if (bVar3) {
          bVar5 = IR::Instr::IsByteCodeUsesInstr((Instr *)checkedSrcs[1]);
          bVar3 = false;
          if (!bVar5) goto LAB_004e7fa7;
        }
        bVar3 = *(short *)&checkedSrcs[1][3]._vptr_Opnd != 0x246;
      }
    }
LAB_004e7fa7:
    if (!bVar3) {
      while( true ) {
        bVar3 = false;
        if (checkedSrcs[1] != (Opnd *)0x0) {
          bVar3 = *(short *)&checkedSrcs[1][3]._vptr_Opnd == 0x246;
        }
        if (!bVar3) break;
        pOStack_58 = IR::Instr::GetSrc1((Instr *)checkedSrcs[1]);
        checkedSrcs[0] = IR::Instr::GetSrc2((Instr *)checkedSrcs[1]);
        checkedSrc._4_4_ = 0;
        while( true ) {
          bVar3 = false;
          if (checkedSrc._4_4_ < 2) {
            bVar3 = *(long *)((long)&stack0xffffffffffffffa8 + (long)(int)checkedSrc._4_4_ * 8) != 0
            ;
          }
          if (!bVar3) break;
          pOVar1 = *(Opnd **)((long)&stack0xffffffffffffffa8 + (long)(int)checkedSrc._4_4_ * 8);
          bVar3 = IR::Opnd::IsEqual(pOVar1,opnd);
          if ((bVar3) &&
             (bVar3 = ProcessArrayRegOpndUse::anon_class_8_1_0cadc770::operator()
                                ((anon_class_8_1_0cadc770 *)&this_local,pOVar1), bVar3)) {
            if (noImplicitCallUsesInstrRef == (Instr **)0x0) {
              return pOVar1;
            }
            *noImplicitCallUsesInstrRef = (Instr *)checkedSrcs[1];
            return pOVar1;
          }
          checkedSrc._4_4_ = checkedSrc._4_4_ + 1;
        }
        checkedSrcs[1] = *(Opnd **)&checkedSrcs[1][1].m_valueType;
      }
      if (noImplicitCallUsesInstrRef != (Instr **)0x0) {
        *noImplicitCallUsesInstrRef = (Instr *)0x0;
      }
      return (Opnd *)0x0;
    }
    checkedSrcs[1] = *(Opnd **)&checkedSrcs[1][1].m_valueType;
  } while( true );
}

Assistant:

IR::Opnd *
BackwardPass::FindNoImplicitCallUse(
    IR::Instr *const instr,
    IR::Opnd *const opnd,
    const F IsCheckedUse,
    IR::Instr * *const noImplicitCallUsesInstrRef)
{
    Assert(instr);
    Assert(instr->m_opcode != Js::OpCode::NoImplicitCallUses);

    // Skip byte-code uses
    IR::Instr *prevInstr = instr->m_prev;
    while(
        prevInstr &&
        !prevInstr->IsLabelInstr() &&
        (!prevInstr->IsRealInstr() || prevInstr->IsByteCodeUsesInstr()) &&
        prevInstr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        prevInstr = prevInstr->m_prev;
    }

    // Find the corresponding use in a NoImplicitCallUses instruction
    for(; prevInstr && prevInstr->m_opcode == Js::OpCode::NoImplicitCallUses; prevInstr = prevInstr->m_prev)
    {
        IR::Opnd *const checkedSrcs[] = { prevInstr->GetSrc1(), prevInstr->GetSrc2() };
        for(int i = 0; i < sizeof(checkedSrcs) / sizeof(checkedSrcs[0]) && checkedSrcs[i]; ++i)
        {
            IR::Opnd *const checkedSrc = checkedSrcs[i];
            if(checkedSrc->IsEqual(opnd) && IsCheckedUse(checkedSrc))
            {
                if(noImplicitCallUsesInstrRef)
                {
                    *noImplicitCallUsesInstrRef = prevInstr;
                }
                return checkedSrc;
            }
        }
    }

    if(noImplicitCallUsesInstrRef)
    {
        *noImplicitCallUsesInstrRef = nullptr;
    }
    return nullptr;
}